

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O2

void __thiscall
asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>::
set_verify_mode(stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *this,
               verify_mode v)

{
  error_code ec;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  set_verify_mode(this,v,&local_28);
  asio::detail::throw_error(&local_28,"set_verify_mode");
  return;
}

Assistant:

void set_verify_mode(verify_mode v)
  {
    asio::error_code ec;
    set_verify_mode(v, ec);
    asio::detail::throw_error(ec, "set_verify_mode");
  }